

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compiler.cpp
# Opt level: O0

Oop __thiscall
Lodtalk::MethodCompiler::visitMessageSendNode(MethodCompiler *this,MessageSendNode *node)

{
  bool bVar1;
  bool bVar2;
  uint uVar3;
  CompilerOptimizedSelector optimizedSelector_00;
  Node *pNVar4;
  vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_> *this_00
  ;
  size_type sVar5;
  size_type sVar6;
  const_reference ppMVar7;
  Oop OVar8;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *this_01;
  reference ppNVar9;
  size_type sVar10;
  int in_R8D;
  MessageSendNode *local_c8;
  Node **arg;
  const_iterator __end2;
  const_iterator __begin2;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *__range2;
  vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_> *arguments;
  Oop selector_1;
  value_type message;
  int i;
  int lastIndex;
  bool first;
  CompilerOptimizedSelector optimizedSelector;
  Oop selector;
  vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_> *chained
  ;
  bool isSuper;
  MessageSendNode *node_local;
  MethodCompiler *this_local;
  
  pNVar4 = AST::MessageSendNode::getReceiver(node);
  uVar3 = (*pNVar4->_vptr_Node[7])();
  this_00 = AST::MessageSendNode::getChainedMessages(node);
  if (((uVar3 & 1) == 0) &&
     (bVar1 = std::
              vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
              ::empty(this_00), bVar1)) {
    OVar8 = AST::MessageSendNode::getSelectorOop(node);
    optimizedSelector_00 = VMContext::getCompilerOptimizedSelectorId(this->context,OVar8);
    if ((optimizedSelector_00 != Invalid) &&
       (bVar1 = generateOptimizedMessage(this,node,optimizedSelector_00), bVar1)) {
      Oop::Oop((Oop *)&this_local);
      return (Oop)(anon_union_8_4_0eb573b0_for_Oop_0)this_local;
    }
  }
  pNVar4 = AST::MessageSendNode::getReceiver(node);
  (*pNVar4->_vptr_Node[2])(pNVar4,this);
  bVar1 = true;
  sVar5 = std::
          vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
          ::size(this_00);
  for (message._4_4_ = -1;
      sVar6 = std::
              vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
              ::size(this_00), message._4_4_ < (int)sVar6; message._4_4_ = message._4_4_ + 1) {
    local_c8 = node;
    if (-1 < message._4_4_) {
      ppMVar7 = std::
                vector<Lodtalk::AST::MessageSendNode_*,_std::allocator<Lodtalk::AST::MessageSendNode_*>_>
                ::operator[](this_00,(long)message._4_4_);
      local_c8 = *ppMVar7;
    }
    OVar8 = AST::MessageSendNode::getSelectorOop(local_c8);
    if (bVar1) {
      bVar1 = false;
    }
    else {
      MethodAssembler::Assembler::popStackTop(&this->gen);
    }
    if (message._4_4_ != (int)sVar5 + -1) {
      MethodAssembler::Assembler::duplicateStackTop(&this->gen);
    }
    this_01 = AST::MessageSendNode::getArguments(local_c8);
    __end2 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::begin
                       (this_01);
    arg = (Node **)std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::end
                             (this_01);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<Lodtalk::AST::Node_*const_*,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
                                       *)&arg), bVar2) {
      ppNVar9 = __gnu_cxx::
                __normal_iterator<Lodtalk::AST::Node_*const_*,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
                ::operator*(&__end2);
      (*(*ppNVar9)->_vptr_Node[2])(*ppNVar9,this);
      __gnu_cxx::
      __normal_iterator<Lodtalk::AST::Node_*const_*,_std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>_>
      ::operator++(&__end2);
    }
    if ((uVar3 & 1) == 0) {
      sVar10 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::size
                         (this_01);
      MethodAssembler::Assembler::send
                (&this->gen,OVar8.field_0._0_4_,(void *)(sVar10 & 0xffffffff),sVar6,in_R8D);
    }
    else {
      sVar6 = std::vector<Lodtalk::AST::Node_*,_std::allocator<Lodtalk::AST::Node_*>_>::size
                        (this_01);
      MethodAssembler::Assembler::superSend(&this->gen,OVar8,(int)sVar6);
    }
  }
  Oop::Oop((Oop *)&this_local);
  return (Oop)(anon_union_8_4_0eb573b0_for_Oop_0)this_local;
}

Assistant:

Oop MethodCompiler::visitMessageSendNode(MessageSendNode *node)
{
	// Visit the receiver.
	bool isSuper = node->getReceiver()->isSuperReference();

	// Visit the arguments in reverse order.
	auto &chained = node->getChainedMessages();

    // Only try to optimize some message when they aren't in a chain.
    if(!isSuper && chained.empty())
    {
        auto selector = node->getSelectorOop();

        // If this is an optimized message, try to optimize
        auto optimizedSelector = context->getCompilerOptimizedSelectorId(selector);
        if(optimizedSelector != CompilerOptimizedSelector::Invalid)
        {
            if(generateOptimizedMessage(node, optimizedSelector))
                return Oop();
        }
    }

    node->getReceiver()->acceptVisitor(this);

	// Send each message in the chain
	bool first = true;
    int lastIndex = (int)chained.size() - 1;
	for(int i = -1; i < (int)chained.size(); ++i)
	{
		auto message = i < 0 ? node : chained[i];
		auto selector = message->getSelectorOop();

		if(first)
			first = false;
		else
			gen.popStackTop();
        if(i != lastIndex)
            gen.duplicateStackTop();

		// Evaluate the arguments.
		auto &arguments = message->getArguments();
		for(auto &arg : arguments)
			arg->acceptVisitor(this);

		// Send the message.
        if(isSuper)
            gen.superSend(selector, (int)arguments.size());
        else
		    gen.send(selector, (int)arguments.size());
	}

	return Oop();
}